

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall args::NamedBase::Name_abi_cxx11_(NamedBase *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x30));
  return in_RDI;
}

Assistant:

virtual std::string Name() const
            {
                return name;
            }